

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void decode_opc_mxu__pool00_cold_4(void)

{
  int in_ESI;
  TCGContext_conflict4 *in_RDI;
  
  tcg_gen_op2_mipsel(in_RDI,INDEX_op_movi_i32,
                     (TCGArg)((long)&in_RDI->pool_cur + (long)in_RDI->mxu_gpr[in_ESI - 1]),0);
  return;
}

Assistant:

static void gen_mxu_D16MAX_D16MIN(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t pad, opc, XRc, XRb, XRa;

    pad = extract32(ctx->opcode, 21, 5);
    opc = extract32(ctx->opcode, 18, 3);
    XRc = extract32(ctx->opcode, 14, 4);
    XRb = extract32(ctx->opcode, 10, 4);
    XRa = extract32(ctx->opcode,  6, 4);

    if (unlikely(pad != 0)) {
        /* opcode padding incorrect -> do nothing */
    } else if (unlikely(XRc == 0)) {
        /* destination is zero register -> do nothing */
    } else if (unlikely((XRb == 0) && (XRa == 0))) {
        /* both operands zero registers -> just set destination to zero */
        tcg_gen_movi_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRc - 1], 0);
    } else if (unlikely((XRb == 0) || (XRa == 0))) {
        /* exactly one operand is zero register - find which one is not...*/
        uint32_t XRx = XRb ? XRb : XRc;
        /* ...and do half-word-wise max/min with one operand 0 */
        TCGv_i32 t0 = tcg_temp_new(tcg_ctx);
        TCGv_i32 t1 = tcg_const_i32(tcg_ctx, 0);

        /* the left half-word first */
        tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->mxu_gpr[XRx - 1], 0xFFFF0000);
        if (opc == OPC_MXU_D16MAX) {
            tcg_gen_smax_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], t0, t1);
        } else {
            tcg_gen_smin_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], t0, t1);
        }

        /* the right half-word */
        tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->mxu_gpr[XRx - 1], 0x0000FFFF);
        /* move half-words to the leftmost position */
        tcg_gen_shli_i32(tcg_ctx, t0, t0, 16);
        /* t0 will be max/min of t0 and t1 */
        if (opc == OPC_MXU_D16MAX) {
            tcg_gen_smax_i32(tcg_ctx, t0, t0, t1);
        } else {
            tcg_gen_smin_i32(tcg_ctx, t0, t0, t1);
        }
        /* return resulting half-words to its original position */
        tcg_gen_shri_i32(tcg_ctx, t0, t0, 16);
        /* finaly update the destination */
        tcg_gen_or_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], tcg_ctx->mxu_gpr[XRa - 1], t0);

        tcg_temp_free(tcg_ctx, t1);
        tcg_temp_free(tcg_ctx, t0);
    } else if (unlikely(XRb == XRc)) {
        /* both operands same -> just set destination to one of them */
        tcg_gen_mov_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], tcg_ctx->mxu_gpr[XRb - 1]);
    } else {
        /* the most general case */
        TCGv_i32 t0 = tcg_temp_new(tcg_ctx);
        TCGv_i32 t1 = tcg_temp_new(tcg_ctx);

        /* the left half-word first */
        tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->mxu_gpr[XRb - 1], 0xFFFF0000);
        tcg_gen_andi_i32(tcg_ctx, t1, tcg_ctx->mxu_gpr[XRc - 1], 0xFFFF0000);
        if (opc == OPC_MXU_D16MAX) {
            tcg_gen_smax_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], t0, t1);
        } else {
            tcg_gen_smin_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], t0, t1);
        }

        /* the right half-word */
        tcg_gen_andi_i32(tcg_ctx, t0, tcg_ctx->mxu_gpr[XRb - 1], 0x0000FFFF);
        tcg_gen_andi_i32(tcg_ctx, t1, tcg_ctx->mxu_gpr[XRc - 1], 0x0000FFFF);
        /* move half-words to the leftmost position */
        tcg_gen_shli_i32(tcg_ctx, t0, t0, 16);
        tcg_gen_shli_i32(tcg_ctx, t1, t1, 16);
        /* t0 will be max/min of t0 and t1 */
        if (opc == OPC_MXU_D16MAX) {
            tcg_gen_smax_i32(tcg_ctx, t0, t0, t1);
        } else {
            tcg_gen_smin_i32(tcg_ctx, t0, t0, t1);
        }
        /* return resulting half-words to its original position */
        tcg_gen_shri_i32(tcg_ctx, t0, t0, 16);
        /* finaly update the destination */
        tcg_gen_or_i32(tcg_ctx, tcg_ctx->mxu_gpr[XRa - 1], tcg_ctx->mxu_gpr[XRa - 1], t0);

        tcg_temp_free(tcg_ctx, t1);
        tcg_temp_free(tcg_ctx, t0);
    }
}